

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

bool vk::fullTextureFormatRoundTripSupported(VkFormat format)

{
  bool bVar1;
  TextureFormat TVar2;
  ChannelType CStack_14;
  TextureFormat tcuFormat;
  VkFormat format_local;
  
  bVar1 = isScaledFormat(format);
  if (bVar1) {
    TVar2 = mapVkFormat(format);
    CStack_14 = TVar2.type;
    if (((CStack_14 - SIGNED_INT_1010102_REV < 2) || (CStack_14 - SIGNED_INT8 < 5)) ||
       (CStack_14 == UNSIGNED_INT32)) {
      tcuFormat.type._3_1_ = SNORM_INT8 >> 0x18;
    }
    else {
      tcuFormat.type._3_1_ = 1;
    }
  }
  else if (format - VK_FORMAT_A8B8G8R8_UNORM_PACK32 < 7) {
    tcuFormat.type._3_1_ = SNORM_INT8 >> 0x18;
  }
  else {
    tcuFormat.type._3_1_ = format != VK_FORMAT_UNDEFINED;
  }
  return (bool)tcuFormat.type._3_1_;
}

Assistant:

static bool fullTextureFormatRoundTripSupported (VkFormat format)
{
	if (isScaledFormat(format))
	{
		// *SCALED formats get mapped to correspoding (u)int formats since
		// accessing them through (float) getPixel/setPixel has same behavior
		// as in shader access in Vulkan.
		// Unfortunately full round-trip between tcu::TextureFormat and VkFormat
		// for most SCALED formats is not supported though.

		const tcu::TextureFormat	tcuFormat	= mapVkFormat(format);

		switch (tcuFormat.type)
		{
			case tcu::TextureFormat::UNSIGNED_INT8:
			case tcu::TextureFormat::UNSIGNED_INT16:
			case tcu::TextureFormat::UNSIGNED_INT32:
			case tcu::TextureFormat::SIGNED_INT8:
			case tcu::TextureFormat::SIGNED_INT16:
			case tcu::TextureFormat::SIGNED_INT32:
			case tcu::TextureFormat::UNSIGNED_INT_1010102_REV:
			case tcu::TextureFormat::SIGNED_INT_1010102_REV:
				return false;

			default:
				return true;
		}
	}
	else
	{
		switch (format)
		{
			case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
			case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
			case VK_FORMAT_A8B8G8R8_USCALED_PACK32:
			case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:
			case VK_FORMAT_A8B8G8R8_UINT_PACK32:
			case VK_FORMAT_A8B8G8R8_SINT_PACK32:
			case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
				return false; // These map to regular byte array formats

			default:
				break;
		}

		return (format != VK_FORMAT_UNDEFINED);
	}
}